

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qobject.cpp
# Opt level: O3

void QObject::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QObjectData *pQVar1;
  undefined8 *puVar2;
  QArrayData *data;
  char16_t *pcVar3;
  undefined8 *puVar4;
  code *pcVar5;
  long lVar6;
  _func_int **pp_Var7;
  QObject *pQVar8;
  int iVar9;
  QObject *parent;
  long in_FS_OFFSET;
  undefined8 local_40;
  QString local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      local_40 = *_a[1];
      break;
    case 1:
      local_40 = 0;
      break;
    case 2:
      local_38.d.ptr = (char16_t *)_a[1];
      local_38.d.size = (qsizetype)&local_40;
      iVar9 = 2;
      goto LAB_002b81f0;
    case 3:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        deleteLater(_o);
        return;
      }
      goto LAB_002b823f;
    default:
      goto switchD_002b7f5e_default;
    }
    local_38.d.ptr = (char16_t *)&local_40;
    iVar9 = 0;
LAB_002b81f0:
    local_38.d.d = (Data *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar9,(void **)&local_38);
    break;
  case ReadProperty:
    if (_id == 0) {
      puVar2 = (undefined8 *)*_a;
      objectName(&local_38,_o);
      data = (QArrayData *)*puVar2;
      pcVar3 = (char16_t *)puVar2[1];
      *puVar2 = local_38.d.d;
      puVar2[1] = local_38.d.ptr;
      puVar4 = (undefined8 *)puVar2[2];
      puVar2[2] = local_38.d.size;
      local_38.d.d = (Data *)data;
      local_38.d.ptr = pcVar3;
      local_38.d.size = (qsizetype)puVar4;
      if (data != (QArrayData *)0x0) {
        LOCK();
        (data->ref_)._q_value.super___atomic_base<int>._M_i =
             (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(data,2,0x10);
        }
      }
    }
    break;
  case WriteProperty:
    if (_id == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        doSetObjectName(_o,(QString *)*_a);
        return;
      }
      goto LAB_002b823f;
    }
    break;
  default:
    if (_c == BindableProperty && _id == 0) {
      pQVar1 = (_o->d_ptr).d;
      pp_Var7 = pQVar1[1]._vptr_QObjectData;
      if (pp_Var7 == (_func_int **)0x0) {
        pp_Var7 = (_func_int **)operator_new(0x80);
        *pp_Var7 = (_func_int *)0x0;
        pp_Var7[1] = (_func_int *)0x0;
        pp_Var7[2] = (_func_int *)0x0;
        pp_Var7[3] = (_func_int *)0x0;
        pp_Var7[4] = (_func_int *)0x0;
        pp_Var7[5] = (_func_int *)0x0;
        pp_Var7[6] = (_func_int *)0x0;
        pp_Var7[7] = (_func_int *)0x0;
        pp_Var7[8] = (_func_int *)0x0;
        pp_Var7[9] = (_func_int *)0x0;
        pp_Var7[10] = (_func_int *)0x0;
        pp_Var7[0xb] = (_func_int *)0x0;
        pp_Var7[0xc] = (_func_int *)0x0;
        pp_Var7[0xd] = (_func_int *)0x0;
        pp_Var7[0xe] = (_func_int *)0x0;
        pp_Var7[0xf] = (_func_int *)pQVar1;
        pQVar1[1]._vptr_QObjectData = pp_Var7;
      }
      puVar2 = (undefined8 *)*_a;
      *puVar2 = pp_Var7 + 0xc;
      puVar2[1] = &QtPrivate::
                   QBindableInterfaceForProperty<QObjectCompatProperty<QObjectPrivate::ExtraData,_QString,_&QObjectPrivate::ExtraData::_qt_property_objectName_offset,_&QObjectPrivate::ExtraData::setObjectNameForwarder,_&QObjectPrivate::ExtraData::nameChangedForwarder,_nullptr>,_void>
                   ::iface;
    }
    break;
  case CreateInstance:
    if (_id == 1) {
      pQVar8 = (QObject *)operator_new(0x10);
      QObject(pQVar8,(QObject *)0x0);
    }
    else {
      if (_id != 0) break;
      pQVar8 = (QObject *)operator_new(0x10);
      QObject(pQVar8,*_a[1]);
    }
    if ((undefined8 *)*_a != (undefined8 *)0x0) {
      *(QObject **)*_a = pQVar8;
    }
    break;
  case IndexOfMethod:
    pcVar5 = *_a[1];
    lVar6 = *(long *)((long)_a[1] + 8);
    if (pcVar5 == destroyed && lVar6 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar5 == objectNameChanged && lVar6 == 0) {
      *(undefined4 *)*_a = 2;
    }
    break;
  case ConstructInPlace:
    if (_id == 1) {
      pQVar8 = (QObject *)*_a;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        parent = (QObject *)0x0;
LAB_002b814d:
        QObject(pQVar8,parent);
        return;
      }
      goto LAB_002b823f;
    }
    if (_id == 0) {
      pQVar8 = (QObject *)*_a;
      parent = *_a[1];
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) goto LAB_002b814d;
      goto LAB_002b823f;
    }
  }
switchD_002b7f5e_default:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_002b823f:
  __stack_chk_fail();
}

Assistant:

void QObject::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QObject *>(_o);
    if (_c == QMetaObject::CreateInstance) {
        switch (_id) {
        case 0: { QObject *_r = new QObject((*reinterpret_cast<std::add_pointer_t<QObject*>>(_a[1])));
            if (_a[0]) *reinterpret_cast<QObject**>(_a[0]) = _r; } break;
        case 1: { QObject *_r = new QObject();
            if (_a[0]) *reinterpret_cast<QObject**>(_a[0]) = _r; } break;
        default: break;
        }
    }
    if (_c == QMetaObject::ConstructInPlace) {
        switch (_id) {
        case 0: { new (_a[0]) QObject((*reinterpret_cast<std::add_pointer_t<QObject*>>(_a[1]))); } break;
        case 1: { new (_a[0]) QObject(); } break;
        default: break;
        }
    }
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->destroyed((*reinterpret_cast< std::add_pointer_t<QObject*>>(_a[1]))); break;
        case 1: _t->destroyed(); break;
        case 2: _t->objectNameChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])), QPrivateSignal()); break;
        case 3: _t->deleteLater(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QObject::*)(QObject * )>(_a, &QObject::destroyed, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QObject::*)(const QString & , QPrivateSignal)>(_a, &QObject::objectNameChanged, 2))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QString*>(_v) = _t->objectName(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setObjectName(*reinterpret_cast<QString*>(_v)); break;
        default: break;
        }
    }
    if (_c == QMetaObject::BindableProperty) {
        switch (_id) {
        case 0: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableObjectName(); break;
        default: break;
        }
    }
}